

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O2

void __thiscall onmt::Tokenizer::Options::Options(Options *this)

{
  this->mode = Conservative;
  (this->lang)._M_dataplus._M_p = (pointer)&(this->lang).field_2;
  (this->lang)._M_string_length = 0;
  (this->lang).field_2._M_local_buf[0] = '\0';
  this->no_substitution = false;
  this->case_feature = false;
  this->case_markup = false;
  this->soft_case_regions = false;
  this->with_separators = false;
  this->allow_isolated_marks = false;
  this->joiner_annotate = false;
  this->joiner_new = false;
  (this->joiner)._M_dataplus._M_p = (pointer)&(this->joiner).field_2;
  (this->joiner)._M_string_length = 0;
  (this->joiner).field_2._M_local_buf[0] = '\0';
  this->spacer_annotate = false;
  this->spacer_new = false;
  this->preserve_placeholders = false;
  this->preserve_segmented_tokens = false;
  this->support_prior_joiners = false;
  this->segment_case = false;
  this->segment_numbers = false;
  this->segment_alphabet_change = false;
  (this->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segment_alphabet).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->segment_alphabet_codes)._M_h._M_buckets =
       &(this->segment_alphabet_codes)._M_h._M_single_bucket;
  (this->segment_alphabet_codes)._M_h._M_bucket_count = 1;
  (this->segment_alphabet_codes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->segment_alphabet_codes)._M_h._M_element_count = 0;
  (this->segment_alphabet_codes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->segment_alphabet_codes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->segment_alphabet_codes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Options() = default;